

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void search::checkup(SearchInfo *info)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  undefined1 local_30 [8];
  string input;
  SearchInfo *info_local;
  
  input.field_2._8_8_ = info;
  iVar2 = SearchInfo::getStopTime(info);
  if (-1 < iVar2) {
    iVar2 = utils::getTime();
    iVar3 = SearchInfo::getStopTime((SearchInfo *)input.field_2._8_8_);
    if (iVar3 < iVar2) {
      SearchInfo::setStopped((SearchInfo *)input.field_2._8_8_,true);
    }
  }
  bVar1 = utils::inputWaiting();
  if (bVar1) {
    SearchInfo::setStopped((SearchInfo *)input.field_2._8_8_,true);
    std::__cxx11::string::string((string *)local_30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_30);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"quit");
    if (bVar1) {
      SearchInfo::setQuit((SearchInfo *)input.field_2._8_8_,true);
    }
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void search::checkup(SearchInfo& info)
{
    if (info.getStopTime() > -1 && utils::getTime() > info.getStopTime()) {
        info.setStopped(true);
    }
    if (utils::inputWaiting()) {
        info.setStopped(true);
        std::string input;
        std::getline(std::cin, input);
        if (input == "quit") {
            info.setQuit(true);
        }
    }
}